

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

double mpack_expect_double_range(mpack_reader_t *reader,double min_value,double max_value)

{
  double dVar1;
  double dVar2;
  
  dVar1 = mpack_expect_double(reader);
  dVar2 = min_value;
  if ((reader->error == mpack_ok) && ((dVar1 < min_value || (dVar2 = dVar1, max_value < dVar1)))) {
    mpack_reader_flag_error(reader,mpack_error_type);
    dVar2 = min_value;
  }
  return dVar2;
}

Assistant:

double mpack_expect_double_range(mpack_reader_t* reader, double min_value, double max_value) {MPACK_EXPECT_RANGE_IMPL(double, double)}